

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsAttributeLocationTests.cpp
# Opt level: O2

string * __thiscall
deqp::gls::(anonymous_namespace)::getShaderInfoLog_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,Functions *gl,deUint32 shader)

{
  deUint32 dVar1;
  undefined4 in_register_0000000c;
  deInt32 length;
  undefined4 local_1c;
  
  local_1c = 0;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  (**(code **)(this + 0xa70))
            ((ulong)gl & 0xffffffff,0x8b84,&local_1c,CONCAT44(in_register_0000000c,shader));
  dVar1 = (**(code **)(this + 0x800))();
  glu::checkError(dVar1,"glGetShaderiv()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsAttributeLocationTests.cpp"
                  ,0x139);
  std::__cxx11::string::resize((ulong)__return_storage_ptr__,(char)local_1c);
  (**(code **)(this + 0xa58))
            ((ulong)gl & 0xffffffff,(int)__return_storage_ptr__->_M_string_length,0,
             (__return_storage_ptr__->_M_dataplus)._M_p);
  dVar1 = (**(code **)(this + 0x800))();
  glu::checkError(dVar1,"glGetShaderInfoLog()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsAttributeLocationTests.cpp"
                  ,0x13e);
  return __return_storage_ptr__;
}

Assistant:

string getShaderInfoLog (const glw::Functions& gl, deUint32 shader)
{
	deInt32	length = 0;
	string	infoLog;

	gl.getShaderiv(shader, GL_INFO_LOG_LENGTH, &length);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv()");

	infoLog.resize(length, '\0');

	gl.getShaderInfoLog(shader, (glw::GLsizei)infoLog.length(), DE_NULL, &(infoLog[0]));
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderInfoLog()");

	return infoLog;
}